

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O2

int cmocka_run_group_fixture
              (char *function_name,CMFixtureFunction setup_func,CMFixtureFunction teardown_func,
              void **state,void *heap_check_point)

{
  int iVar1;
  
  if (setup_func != (CMFixtureFunction)0x0) {
    iVar1 = cmocka_run_one_test_or_fixture
                      (function_name,(CMUnitTestFunction)0x0,setup_func,(CMFixtureFunction)0x0,state
                       ,heap_check_point);
    return iVar1;
  }
  iVar1 = cmocka_run_one_test_or_fixture
                    (function_name,(CMUnitTestFunction)0x0,(CMFixtureFunction)0x0,teardown_func,
                     state,heap_check_point);
  return iVar1;
}

Assistant:

static int cmocka_run_group_fixture(const char *function_name,
                                    CMFixtureFunction setup_func,
                                    CMFixtureFunction teardown_func,
                                    void **state,
                                    const void *const heap_check_point)
{
    int rc;

    if (setup_func != NULL) {
        rc = cmocka_run_one_test_or_fixture(function_name,
                                        NULL,
                                        setup_func,
                                        NULL,
                                        state,
                                        heap_check_point);
    } else {
        rc = cmocka_run_one_test_or_fixture(function_name,
                                        NULL,
                                        NULL,
                                        teardown_func,
                                        state,
                                        heap_check_point);
    }

    return rc;
}